

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

uint8_t * GetBrotliStorage(BrotliEncoderStateInternal *s,size_t size)

{
  uint8_t *puVar1;
  
  if (s->storage_size_ < size) {
    duckdb_brotli::BrotliFree(&s->memory_manager_,s->storage_);
    s->storage_ = (uint8_t *)0x0;
    puVar1 = (uint8_t *)duckdb_brotli::BrotliAllocate(&s->memory_manager_,size);
    s->storage_ = puVar1;
    s->storage_size_ = size;
  }
  else {
    puVar1 = s->storage_;
  }
  return puVar1;
}

Assistant:

static uint8_t* GetBrotliStorage(BrotliEncoderState* s, size_t size) {
  MemoryManager* m = &s->memory_manager_;
  if (s->storage_size_ < size) {
    BROTLI_FREE(m, s->storage_);
    s->storage_ = BROTLI_ALLOC(m, uint8_t, size);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->storage_)) return NULL;
    s->storage_size_ = size;
  }
  return s->storage_;
}